

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall minja::ElifTemplateToken::~ElifTemplateToken(ElifTemplateToken *this)

{
  (this->super_TemplateToken)._vptr_TemplateToken = (_func_int **)&PTR__ElifTemplateToken_0022c0c0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->condition).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  TemplateToken::~TemplateToken(&this->super_TemplateToken);
  return;
}

Assistant:

ElifTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, std::shared_ptr<Expression> && c) : TemplateToken(Type::Elif, loc, pre, post), condition(std::move(c)) {}